

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void __thiscall
chrono::ChContactContainerNSC::IntLoadResidual_CqL
          (ChContactContainerNSC *this,uint off_L,ChVectorDynamic<> *R,ChVectorDynamic<> *L,double c
          )

{
  uint coffset;
  
  coffset = 0;
  _IntLoadResidual_CqL<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&coffset,&this->contactlist_6_6,off_L,R,L,c,3);
  _IntLoadResidual_CqL<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>>
            (&coffset,&this->contactlist_6_3,off_L,R,L,c,3);
  _IntLoadResidual_CqL<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>>
            (&coffset,&this->contactlist_3_3,off_L,R,L,c,3);
  _IntLoadResidual_CqL<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>>
            (&coffset,&this->contactlist_333_3,off_L,R,L,c,3);
  _IntLoadResidual_CqL<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>>
            (&coffset,&this->contactlist_333_6,off_L,R,L,c,3);
  _IntLoadResidual_CqL<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>>
            (&coffset,&this->contactlist_333_333,off_L,R,L,c,3);
  _IntLoadResidual_CqL<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>>
            (&coffset,&this->contactlist_666_3,off_L,R,L,c,3);
  _IntLoadResidual_CqL<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>>
            (&coffset,&this->contactlist_666_6,off_L,R,L,c,3);
  _IntLoadResidual_CqL<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>>
            (&coffset,&this->contactlist_666_333,off_L,R,L,c,3);
  _IntLoadResidual_CqL<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>>
            (&coffset,&this->contactlist_666_666,off_L,R,L,c,3);
  _IntLoadResidual_CqL<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&coffset,&this->contactlist_6_6_rolling,off_L,R,L,c,6);
  return;
}

Assistant:

void ChContactContainerNSC::IntLoadResidual_CqL(const unsigned int off_L,
                                                ChVectorDynamic<>& R,
                                                const ChVectorDynamic<>& L,
                                                const double c) {
    unsigned int coffset = 0;
    _IntLoadResidual_CqL(coffset, contactlist_6_6, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_6_3, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_3_3, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_333_3, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_333_6, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_333_333, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_666_3, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_666_6, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_666_333, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_666_666, off_L, R, L, c, 3);
    _IntLoadResidual_CqL(coffset, contactlist_6_6_rolling, off_L, R, L, c, 6);
}